

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O3

int lclearbuffer(lua_State *L)

{
  undefined4 *puVar1;
  socket_buffer *extraout_RDX;
  socket_buffer *sb;
  socket_buffer *extraout_RDX_00;
  
  puVar1 = (undefined4 *)lua_touserdata(L,1);
  if (puVar1 != (undefined4 *)0x0) {
    luaL_checktype(L,2,5);
    sb = extraout_RDX;
    while (*(long *)(puVar1 + 2) != 0) {
      return_free_node(L,(int)puVar1,sb);
      sb = extraout_RDX_00;
    }
    *puVar1 = 0;
    return 0;
  }
  luaL_error(L,"Need buffer object at param 1");
}

Assistant:

static int
lclearbuffer(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	luaL_checktype(L,2,LUA_TTABLE);
	while(sb->head) {
		return_free_node(L,2,sb);
	}
	sb->size = 0;
	return 0;
}